

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

bool __thiscall re2::DFA::StateEqual::operator()(StateEqual *this,State *a,State *b)

{
  int i;
  State *b_local;
  State *a_local;
  StateEqual *this_local;
  bool local_1;
  
  if (a == b) {
    local_1 = true;
  }
  else if (a->flag_ == b->flag_) {
    if (a->ninst_ == b->ninst_) {
      for (i = 0; i < a->ninst_; i = i + 1) {
        if (a->inst_[i] != b->inst_[i]) {
          return false;
        }
      }
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool operator()(const State* a, const State* b) const {
      DCHECK(a != NULL);
      DCHECK(b != NULL);
      if (a == b)
        return true;
      if (a->flag_ != b->flag_)
        return false;
      if (a->ninst_ != b->ninst_)
        return false;
      for (int i = 0; i < a->ninst_; i++)
        if (a->inst_[i] != b->inst_[i])
          return false;
      return true;
    }